

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int32 google::protobuf::strto32_adaptor(char *nptr,char **endptr,int base)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int in_EDX;
  char **in_RSI;
  char *in_RDI;
  long result;
  int saved_errno;
  undefined4 local_4;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  piVar2 = __errno_location();
  *piVar2 = 0;
  lVar3 = strtol(in_RDI,in_RSI,in_EDX);
  piVar2 = __errno_location();
  if ((*piVar2 == 0x22) && (lVar3 == -0x8000000000000000)) {
    local_4 = -0x80000000;
  }
  else {
    piVar2 = __errno_location();
    if ((*piVar2 == 0x22) && (lVar3 == 0x7fffffffffffffff)) {
      local_4 = 0x7fffffff;
    }
    else {
      piVar2 = __errno_location();
      if ((*piVar2 == 0) && (lVar3 < -0x80000000)) {
        piVar2 = __errno_location();
        *piVar2 = 0x22;
        local_4 = -0x80000000;
      }
      else {
        piVar2 = __errno_location();
        if ((*piVar2 == 0) && (0x7fffffff < lVar3)) {
          piVar2 = __errno_location();
          *piVar2 = 0x22;
          local_4 = 0x7fffffff;
        }
        else {
          piVar2 = __errno_location();
          if (*piVar2 == 0) {
            piVar2 = __errno_location();
            *piVar2 = iVar1;
          }
          local_4 = (int32)lVar3;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int32 strto32_adaptor(const char *nptr, char **endptr, int base) {
  const int saved_errno = errno;
  errno = 0;
  const long result = strtol(nptr, endptr, base);
  if (errno == ERANGE && result == LONG_MIN) {
    return kint32min;
  } else if (errno == ERANGE && result == LONG_MAX) {
    return kint32max;
  } else if (errno == 0 && result < kint32min) {
    errno = ERANGE;
    return kint32min;
  } else if (errno == 0 && result > kint32max) {
    errno = ERANGE;
    return kint32max;
  }
  if (errno == 0)
    errno = saved_errno;
  return static_cast<int32>(result);
}